

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall
icu_63::UnifiedCache::_putIfAbsentAndGet
          (UnifiedCache *this,CacheKeyBase *key,SharedObject **value,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode local_4c [2];
  UErrorCode putError;
  UHashElement *local_38;
  UHashElement *element;
  Mutex lock;
  UErrorCode *status_local;
  SharedObject **value_local;
  CacheKeyBase *key_local;
  UnifiedCache *this_local;
  
  lock.fMutex = (UMutex *)status;
  Mutex::Mutex((Mutex *)&element,&gCacheMutex);
  local_38 = uhash_find_63(this->fHashtable,key);
  if (local_38 != (UHashElement *)0x0) {
    UVar1 = _inProgress(this,local_38);
    if (UVar1 == '\0') {
      _fetch(this,local_38,value,(UErrorCode *)lock.fMutex);
      local_4c[1] = 1;
      goto LAB_00477226;
    }
  }
  if (local_38 == (UHashElement *)0x0) {
    local_4c[0] = U_ZERO_ERROR;
    _putNew(this,key,*value,((lock.fMutex)->fMutex).__data.__lock,local_4c);
  }
  else {
    _put(this,local_38,*value,((lock.fMutex)->fMutex).__data.__lock);
  }
  _runEvictionSlice(this);
  local_4c[1] = 0;
LAB_00477226:
  Mutex::~Mutex((Mutex *)&element);
  return;
}

Assistant:

void UnifiedCache::_putIfAbsentAndGet(
        const CacheKeyBase &key,
        const SharedObject *&value,
        UErrorCode &status) const {
    Mutex lock(&gCacheMutex);
    const UHashElement *element = uhash_find(fHashtable, &key);
    if (element != NULL && !_inProgress(element)) {
        _fetch(element, value, status);
        return;
    }
    if (element == NULL) {
        UErrorCode putError = U_ZERO_ERROR;
        // best-effort basis only.
        _putNew(key, value, status, putError);
    } else {
        _put(element, value, status);
    }
    // Run an eviction slice. This will run even if we added a master entry
    // which doesn't increase the unused count, but that is still o.k
    _runEvictionSlice();
}